

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O0

int __thiscall MeCab::Connector::open(Connector *this,char *__file,int __oflag,...)

{
  uint uVar1;
  Mmap<short> *pMVar2;
  ostream *poVar3;
  undefined7 extraout_var;
  short *psVar4;
  undefined7 extraout_var_00;
  size_t sVar5;
  undefined7 extraout_var_01;
  unsigned_short *puVar6;
  wlog *this_00;
  wlog *pwVar7;
  undefined7 extraout_var_02;
  whatlog *in_stack_ffffffffffffffa8;
  wlog *in_stack_ffffffffffffffb0;
  wlog local_40;
  wlog local_38;
  wlog local_30;
  wlog local_28;
  undefined8 local_20;
  char *local_18;
  Connector *local_10;
  bool local_1;
  
  local_20 = ___oflag;
  local_18 = __file;
  local_10 = this;
  pMVar2 = scoped_ptr<MeCab::Mmap<short>_>::operator->(&this->cmmap_);
  uVar1 = Mmap<short>::open(pMVar2,local_18,(int)local_20);
  if ((uVar1 & 1) == 0) {
    wlog::wlog(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    poVar3 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x18);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"cmmap_->open(filename, mode)");
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"cannot open: ");
    poVar3 = std::operator<<(poVar3,local_18);
    local_1 = wlog::operator&(&local_28,poVar3);
    this = (Connector *)CONCAT71(extraout_var,local_1);
  }
  else {
    pMVar2 = scoped_ptr<MeCab::Mmap<short>_>::operator->(&this->cmmap_);
    psVar4 = Mmap<short>::begin(pMVar2);
    this->matrix_ = psVar4;
    if (this->matrix_ == (short *)0x0) {
      wlog::wlog(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      poVar3 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1d);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,"matrix_");
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,"matrix is NULL");
      local_1 = wlog::operator&(&local_30,poVar3);
      this = (Connector *)CONCAT71(extraout_var_00,local_1);
    }
    else {
      pMVar2 = scoped_ptr<MeCab::Mmap<short>_>::operator->(&this->cmmap_);
      sVar5 = Mmap<short>::size(pMVar2);
      if (sVar5 < 2) {
        wlog::wlog(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        poVar3 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                                );
        poVar3 = std::operator<<(poVar3,"(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1e);
        poVar3 = std::operator<<(poVar3,") [");
        poVar3 = std::operator<<(poVar3,"cmmap_->size() >= 2");
        poVar3 = std::operator<<(poVar3,"] ");
        poVar3 = std::operator<<(poVar3,"file size is invalid: ");
        poVar3 = std::operator<<(poVar3,local_18);
        local_1 = wlog::operator&(&local_38,poVar3);
        this = (Connector *)CONCAT71(extraout_var_01,local_1);
      }
      else {
        pMVar2 = scoped_ptr<MeCab::Mmap<short>_>::operator*(&this->cmmap_);
        puVar6 = (unsigned_short *)Mmap<short>::operator[](pMVar2,0);
        this->lsize_ = *puVar6;
        pMVar2 = scoped_ptr<MeCab::Mmap<short>_>::operator*(&this->cmmap_);
        puVar6 = (unsigned_short *)Mmap<short>::operator[](pMVar2,1);
        this->rsize_ = *puVar6;
        this_00 = (wlog *)(long)(int)((uint)this->lsize_ * (uint)this->rsize_ + 2);
        pMVar2 = scoped_ptr<MeCab::Mmap<short>_>::operator->(&this->cmmap_);
        pwVar7 = (wlog *)Mmap<short>::size(pMVar2);
        if (this_00 == pwVar7) {
          pMVar2 = scoped_ptr<MeCab::Mmap<short>_>::operator->(&this->cmmap_);
          psVar4 = Mmap<short>::begin(pMVar2);
          this->matrix_ = psVar4 + 2;
          local_1 = true;
        }
        else {
          wlog::wlog(this_00,in_stack_ffffffffffffffa8);
          poVar3 = std::operator<<((ostream *)&this->what_,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,"(");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x25);
          poVar3 = std::operator<<(poVar3,") [");
          poVar3 = std::operator<<(poVar3,
                                   "static_cast<size_t>(lsize_ * rsize_ + 2) == cmmap_->size()");
          poVar3 = std::operator<<(poVar3,"] ");
          poVar3 = std::operator<<(poVar3,"file size is invalid: ");
          poVar3 = std::operator<<(poVar3,local_18);
          local_1 = wlog::operator&(&local_40,poVar3);
          this = (Connector *)CONCAT71(extraout_var_02,local_1);
        }
      }
    }
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool Connector::open(const char* filename,
                     const char *mode) {
  CHECK_FALSE(cmmap_->open(filename, mode))
      << "cannot open: " << filename;

  matrix_ = cmmap_->begin();

  CHECK_FALSE(matrix_) << "matrix is NULL" ;
  CHECK_FALSE(cmmap_->size() >= 2)
      << "file size is invalid: " << filename;

  lsize_ = static_cast<unsigned short>((*cmmap_)[0]);
  rsize_ = static_cast<unsigned short>((*cmmap_)[1]);

  CHECK_FALSE(static_cast<size_t>(lsize_ * rsize_ + 2)
                    == cmmap_->size())
      << "file size is invalid: " << filename;

  matrix_ = cmmap_->begin() + 2;
  return true;
}